

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.h
# Opt level: O0

bool Js::OnlyWritablePropertyCache::ProcessProperty<Js::PropertyRecord_const*>
               (DynamicTypeHandler *typeHandler,PropertyAttributes attributes,
               PropertyRecord *propertyKey,ScriptContext *scriptContext)

{
  byte bVar1;
  PropertyId propertyId_00;
  PropertyId propertyId;
  ScriptContext *scriptContext_local;
  PropertyRecord *propertyKey_local;
  PropertyAttributes attributes_local;
  DynamicTypeHandler *typeHandler_local;
  
  if ((attributes & 4) == 0) {
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties(typeHandler);
    bVar1 = DynamicTypeHandler::GetFlags(typeHandler);
    if ((bVar1 & 0x20) != 0) {
      propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
      ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId_00);
      return true;
    }
  }
  return false;
}

Assistant:

inline bool
OnlyWritablePropertyCache::ProcessProperty(
    _In_ DynamicTypeHandler* typeHandler,
    PropertyAttributes attributes,
    _In_ KeyType propertyKey,
    ScriptContext * scriptContext)
{
    if (!(attributes & PropertyWritable))
    {
        typeHandler->ClearHasOnlyWritableDataProperties();
        if (typeHandler->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            PropertyId propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext, propertyKey);
            scriptContext->InvalidateStoreFieldCaches(propertyId);
            return true;
        }
    }
    return false;
}